

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compact_optional.cpp
# Opt level: O1

void test_string_traits(void)

{
  size_type *psVar1;
  size_type *psVar2;
  size_type *psVar3;
  size_type *psVar4;
  bool bVar5;
  undefined1 local_d0 [8];
  opt_str os_;
  opt_str os00;
  undefined1 local_80 [8];
  size_type sStack_78;
  undefined1 local_70 [8];
  opt_str osA;
  opt_str os0;
  
  psVar3 = &os_.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length;
  os_.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length._0_2_ = 0;
  os_.super_compact_optional_base<string_empty_value>.super_type.value_._M_dataplus._M_p =
       (pointer)0x2;
  os_.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length._2_1_ = 0;
  os0.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length._0_2_ = 0;
  os0.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length._2_1_ = 0;
  psVar4 = &os00.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length;
  os00.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length._0_2_ = 0;
  os00.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length._2_1_ = 0;
  os00.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length._4_4_ =
       os0.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length._4_4_;
  os00.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length._3_1_ =
       os0.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length._3_1_;
  os00.super_compact_optional_base<string_empty_value>.super_type.value_.field_2.
  _M_allocated_capacity._0_3_ =
       os0.super_compact_optional_base<string_empty_value>.super_type.value_.field_2.
       _M_allocated_capacity._0_3_;
  os00.super_compact_optional_base<string_empty_value>.super_type.value_.field_2.
  _M_allocated_capacity._3_4_ =
       CONCAT31(os0.super_compact_optional_base<string_empty_value>.super_type.value_.field_2.
                _M_allocated_capacity._4_3_,
                os0.super_compact_optional_base<string_empty_value>.super_type.value_.field_2.
                _M_local_buf[3]);
  os00.super_compact_optional_base<string_empty_value>.super_type.value_.field_2._M_local_buf[7] =
       os0.super_compact_optional_base<string_empty_value>.super_type.value_.field_2._M_local_buf[7]
  ;
  os00.super_compact_optional_base<string_empty_value>.super_type.value_._M_dataplus._M_p =
       (pointer)0x2;
  psVar1 = &osA.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length;
  local_d0 = (undefined1  [8])psVar3;
  os_.super_compact_optional_base<string_empty_value>.super_type.value_.field_2._8_8_ = psVar4;
  local_70 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"");
  psVar2 = &os0.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length;
  os0.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length._2_1_ =
       (undefined1)
       (osA.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length >>
       0x10);
  os0.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length._3_1_ =
       (undefined1)
       (osA.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length >>
       0x18);
  os0.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length._0_2_ =
       (undefined2)
       osA.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length;
  if (local_70 == (undefined1  [8])psVar1) {
    os0.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length._4_4_ =
         osA.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length.
         _4_4_;
    os0.super_compact_optional_base<string_empty_value>.super_type.value_.field_2.
    _M_allocated_capacity._0_4_ =
         osA.super_compact_optional_base<string_empty_value>.super_type.value_.field_2.
         _M_allocated_capacity._0_4_;
    os0.super_compact_optional_base<string_empty_value>.super_type.value_.field_2.
    _M_allocated_capacity._4_4_ =
         osA.super_compact_optional_base<string_empty_value>.super_type.value_.field_2.
         _M_allocated_capacity._4_4_;
    osA.super_compact_optional_base<string_empty_value>.super_type.value_.field_2._8_8_ = psVar2;
  }
  else {
    osA.super_compact_optional_base<string_empty_value>.super_type.value_.field_2._8_8_ = local_70;
    os0.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length._4_4_ =
         osA.super_compact_optional_base<string_empty_value>.super_type.value_._M_string_length.
         _4_4_;
  }
  os0.super_compact_optional_base<string_empty_value>.super_type.value_._M_dataplus =
       osA.super_compact_optional_base<string_empty_value>.super_type.value_._M_dataplus;
  os00.super_compact_optional_base<string_empty_value>.super_type.value_.field_2._8_8_ = local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             ((long)&os00.super_compact_optional_base<string_empty_value>.super_type.value_.field_2
             + 8),"A","");
  if ((undefined1 *)
      os00.super_compact_optional_base<string_empty_value>.super_type.value_.field_2._8_8_ ==
      local_80) {
    osA.super_compact_optional_base<string_empty_value>.super_type.value_.field_2.
    _M_allocated_capacity = sStack_78;
    local_70 = (undefined1  [8])psVar1;
  }
  else {
    local_70 = (undefined1  [8])
               os00.super_compact_optional_base<string_empty_value>.super_type.value_.field_2._8_8_;
  }
  bVar5 = string_empty_value::is_empty_value((string *)local_d0);
  if (!bVar5) {
    __assert_fail("!os_.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x40,"void test_string_traits()");
  }
  bVar5 = string_empty_value::is_empty_value
                    ((string *)
                     ((long)&os_.super_compact_optional_base<string_empty_value>.super_type.value_.
                             field_2 + 8));
  if (!bVar5) {
    __assert_fail("!os00.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x41,"void test_string_traits()");
  }
  bVar5 = string_empty_value::is_empty_value
                    ((string *)
                     ((long)&osA.super_compact_optional_base<string_empty_value>.super_type.value_.
                             field_2 + 8));
  if (!bVar5) {
    bVar5 = string_empty_value::is_empty_value((string *)local_70);
    if (!bVar5) {
      if (local_70 != (undefined1  [8])psVar1) {
        operator_delete((void *)local_70);
      }
      if ((size_type *)
          osA.super_compact_optional_base<string_empty_value>.super_type.value_.field_2._8_8_ !=
          psVar2) {
        operator_delete((void *)osA.super_compact_optional_base<string_empty_value>.super_type.
                                value_.field_2._8_8_);
      }
      if ((size_type *)
          os_.super_compact_optional_base<string_empty_value>.super_type.value_.field_2._8_8_ !=
          psVar4) {
        operator_delete((void *)os_.super_compact_optional_base<string_empty_value>.super_type.
                                value_.field_2._8_8_);
      }
      if (local_d0 != (undefined1  [8])psVar3) {
        operator_delete((void *)local_d0);
      }
      return;
    }
    __assert_fail("osA.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x43,"void test_string_traits()");
  }
  __assert_fail("os0.has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                ,0x42,"void test_string_traits()");
}

Assistant:

void test_string_traits()
{
  typedef compact_optional<string_empty_value, class tag_X> opt_str;
  static_assert (sizeof(opt_str) == sizeof(std::string), "size waste");
  
  opt_str os_, os00(std::string("\0\0", 2)), os0(std::string("\0")), osA(std::string("A"));
  assert (!os_.has_value());
  assert (!os00.has_value());
  assert ( os0.has_value());
  assert ( osA.has_value());
}